

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O2

void __thiscall MutableS2ShapeIndex::Iterator::Next(Iterator *this)

{
  S2LogMessage SStack_18;
  
  if ((this->super_IteratorBase).id_.id_ != 0xffffffffffffffff) {
    gtl::internal_btree::
    btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
    ::increment(&this->iter_);
    Refresh(this);
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.h"
             ,0x221,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: !done() ");
  abort();
}

Assistant:

~UpdateState() {
      S2_DCHECK_EQ(0, num_waiting);
    }